

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void vli_nativeToBytes(uint8_t *bytes,uint64_t *native)

{
  long lVar1;
  uint8_t *puVar2;
  
  puVar2 = bytes + 0x1f;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    puVar2[-7] = *(uint8_t *)((long)native + lVar1 * 8 + 7);
    puVar2[-6] = *(uint8_t *)((long)native + lVar1 * 8 + 6);
    puVar2[-5] = *(uint8_t *)((long)native + lVar1 * 8 + 5);
    puVar2[-4] = *(uint8_t *)((long)native + lVar1 * 8 + 4);
    puVar2[-3] = *(uint8_t *)((long)native + lVar1 * 8 + 3);
    puVar2[-2] = *(uint8_t *)((long)native + lVar1 * 8 + 2);
    puVar2[-1] = *(uint8_t *)((long)native + lVar1 * 8 + 1);
    *puVar2 = (uint8_t)native[lVar1];
    puVar2 = puVar2 + -8;
  }
  return;
}

Assistant:

static void vli_nativeToBytes(uint8_t *bytes, const uint64_t *native) {
    unsigned i;
    for (i = 0; i < uECC_WORDS; ++i) {
        uint8_t *digit = bytes + 8 * (uECC_WORDS - 1 - i);
        digit[0] = native[i] >> 56;
        digit[1] = native[i] >> 48;
        digit[2] = native[i] >> 40;
        digit[3] = native[i] >> 32;
        digit[4] = native[i] >> 24;
        digit[5] = native[i] >> 16;
        digit[6] = native[i] >> 8;
        digit[7] = native[i];
    }
}